

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ComputeGravityForces(ChElementHexaANCF_3813_9 *this)

{
  ChVector<double> *in_RDX;
  ChVectorDynamic<> *in_RSI;
  
  ComputeGravityForces((ChElementHexaANCF_3813_9 *)&this[-1].field_0x52f8,in_RSI,in_RDX);
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::ComputeGravityForces(ChVectorDynamic<>& Fg, const ChVector<>& G_acc) {
    assert(Fg.size() == 33);

    // Calculate and add the generalized force due to gravity to the generalized internal force vector for the element.
    // The generalized force due to gravity could be computed once prior to the start of the simulation if gravity was
    // assumed constant throughout the entire simulation.  However, this implementation assumes that the acceleration
    // due to gravity, while a constant for the entire system, can change from step to step which could be useful for
    // gravity loaded units tests as an example.  The generalized force due to gravity is calculated in compact matrix
    // form and is pre-mapped to the desired vector format
    Eigen::Map<ChMatrixNM<double, 11, 3>> GravForceCompact(Fg.data(), 11, 3);
    GravForceCompact = m_GravForceScale * G_acc.eigen().transpose();
}